

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_menu_begin_image(nk_context *ctx,char *id,nk_image img,nk_vec2 size)

{
  nk_widget_layout_states nVar1;
  int iVar2;
  nk_context *local_60;
  uint local_4c;
  nk_flags state;
  int is_clicked;
  nk_input *in;
  nk_rect header;
  nk_window *win;
  char *id_local;
  nk_context *ctx_local;
  nk_vec2 size_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x5578,
                  "int nk_menu_begin_image(struct nk_context *, const char *, struct nk_image, struct nk_vec2)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    if (ctx->current->layout != (nk_panel *)0x0) {
      if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
         (ctx->current->layout == (nk_panel *)0x0)) {
        size_local.x = 0.0;
      }
      else {
        header._8_8_ = ctx->current;
        nVar1 = nk_widget((nk_rect *)&in,ctx);
        if (nVar1 == NK_WIDGET_INVALID) {
          size_local.x = 0.0;
        }
        else {
          if ((nVar1 == NK_WIDGET_ROM) ||
             (local_60 = ctx, (*(uint *)(*(long *)(header._8_8_ + 0xa8) + 4) & 0x800) != 0)) {
            local_60 = (nk_context *)0x0;
          }
          iVar2 = nk_do_button_image(&ctx->last_widget_state,
                                     (nk_command_buffer *)(header._8_8_ + 0x68),_in,img,
                                     NK_BUTTON_DEFAULT,&(ctx->style).menu_button,&local_60->input);
          local_4c = (uint)(iVar2 != 0);
          size_local.x = (float)nk_menu_begin(ctx,(nk_window *)header._8_8_,id,local_4c,_in,size);
        }
      }
      return (int)size_local.x;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x557a,
                  "int nk_menu_begin_image(struct nk_context *, const char *, struct nk_image, struct nk_vec2)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x5579,
                "int nk_menu_begin_image(struct nk_context *, const char *, struct nk_image, struct nk_vec2)"
               );
}

Assistant:

NK_API int
nk_menu_begin_image(struct nk_context *ctx, const char *id, struct nk_image img,
    struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_rect header;
    const struct nk_input *in;
    int is_clicked = nk_false;
    nk_flags state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    state = nk_widget(&header, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || win->layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    if (nk_do_button_image(&ctx->last_widget_state, &win->buffer, header,
        img, NK_BUTTON_DEFAULT, &ctx->style.menu_button, in))
        is_clicked = nk_true;
    return nk_menu_begin(ctx, win, id, is_clicked, header, size);
}